

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger thread_call(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQInteger params;
  SQRESULT SVar3;
  SQRESULT SVar4;
  SQInteger i;
  long idx;
  SQObjectPtr o;
  
  pSVar2 = stack_get(v,1);
  o.super_SQObject._type = (pSVar2->super_SQObject)._type;
  o.super_SQObject._unVal = (pSVar2->super_SQObject)._unVal;
  if ((o.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if (o.super_SQObject._type == OT_THREAD) {
    params = sq_gettop(v);
    SQVM::Push(o.super_SQObject._unVal.pThread,&(o.super_SQObject._unVal.pThread)->_roottable);
    for (idx = 2; idx <= params; idx = idx + 1) {
      sq_move((HSQUIRRELVM)o.super_SQObject._unVal.pTable,v,idx);
    }
    SVar3 = 1;
    SVar4 = sq_call((HSQUIRRELVM)o.super_SQObject._unVal.pTable,params,1,1);
    if (SVar4 < 0) {
      SQObjectPtr::operator=(&v->_lasterror,&(o.super_SQObject._unVal.pNativeClosure)->_name);
      SVar3 = -1;
    }
    else {
      sq_move(v,(HSQUIRRELVM)o.super_SQObject._unVal.pTable,-1);
      sq_pop((HSQUIRRELVM)o.super_SQObject._unVal.pTable,1);
    }
  }
  else {
    SVar3 = sq_throwerror(v,"wrong parameter");
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar3;
}

Assistant:

static SQInteger thread_call(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQInteger nparams = sq_gettop(v);
        _thread(o)->Push(_thread(o)->_roottable);
        for(SQInteger i = 2; i<(nparams+1); i++)
            sq_move(_thread(o),v,i);
        if(SQ_SUCCEEDED(sq_call(_thread(o),nparams,SQTrue,SQTrue))) {
            sq_move(v,_thread(o),-1);
            sq_pop(_thread(o),1);
            return 1;
        }
        v->_lasterror = _thread(o)->_lasterror;
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}